

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfd::ConfidentialTransactionController::AddPeginWitness
          (ConfidentialTransactionController *this,Txid *txid,uint32_t vout,Amount *amount,
          ConfidentialAssetId *asset_id,BlockHash *mainchain_genesis_block_hash,Script *claim_script
          ,ByteData *mainchain_pegin_transaction,ByteData *tx_out_proof)

{
  ConfidentialTransactionController *in_RCX;
  ConfidentialAssetId *in_R8;
  BlockHash *in_R9;
  Script *in_stack_00000008;
  value_type *in_stack_00000010;
  value_type *in_stack_00000018;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> witness_datas;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *in_stack_ffffffffffffff50;
  ByteData local_a0;
  ByteData local_88;
  ByteData local_60;
  pointer in_stack_ffffffffffffffc8;
  uint32_t vout_00;
  
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &stack0xffffffffffffffb8);
  core::Amount::GetByteData(&local_60,(Amount *)in_RCX);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &stack0xffffffffffffffb8,&local_60);
  core::ByteData::~ByteData((ByteData *)0x558c3a);
  core::ConfidentialAssetId::GetUnblindedData(&local_88,in_R8);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &stack0xffffffffffffffb8,&local_88);
  core::ByteData::~ByteData((ByteData *)0x558c6c);
  core::BlockHash::GetData(&local_a0,in_R9);
  vout_00 = (uint32_t)((ulong)in_R9 >> 0x20);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &stack0xffffffffffffffb8,&local_a0);
  core::ByteData::~ByteData((ByteData *)0x558c9e);
  core::Script::GetData((ByteData *)&stack0xffffffffffffff48,in_stack_00000008);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &stack0xffffffffffffffb8,(value_type *)&stack0xffffffffffffff48);
  core::ByteData::~ByteData((ByteData *)0x558cd0);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &stack0xffffffffffffffb8,in_stack_00000010);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &stack0xffffffffffffffb8,in_stack_00000018);
  AddPeginWitness(in_RCX,(Txid *)in_R8,vout_00,
                  (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                  in_stack_ffffffffffffffc8);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            (in_stack_ffffffffffffff50);
  return;
}

Assistant:

void ConfidentialTransactionController::AddPeginWitness(
    const Txid& txid, uint32_t vout, const Amount& amount,
    const ConfidentialAssetId& asset_id,
    const BlockHash& mainchain_genesis_block_hash, const Script& claim_script,
    const ByteData& mainchain_pegin_transaction,
    const ByteData& tx_out_proof) {
  std::vector<ByteData> witness_datas;
  witness_datas.push_back(amount.GetByteData());
  witness_datas.push_back(asset_id.GetUnblindedData());
  witness_datas.push_back(mainchain_genesis_block_hash.GetData());
  witness_datas.push_back(claim_script.GetData());
  witness_datas.push_back(mainchain_pegin_transaction);
  witness_datas.push_back(tx_out_proof);

  AddPeginWitness(txid, vout, witness_datas);
}